

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_platform.c
# Opt level: O2

__fd_t light_open(char *file_name,__read_mode_t mode)

{
  FILE *pFVar1;
  
  if (mode < (LIGHT_OAPPEND|LIGHT_OWRITE)) {
    pFVar1 = fopen(file_name,&DAT_001054cc + *(int *)(&DAT_001054cc + (ulong)mode * 4));
    return (__fd_t)pFVar1;
  }
  return (__fd_t)0x0;
}

Assistant:

__fd_t light_open(const char *file_name, const __read_mode_t mode)
{
	__fd_t fd = (__fd_t)INVALID_FILE;

	switch (mode) {
	case LIGHT_OREAD:
		fd = fopen(file_name, "rb");
		break;
	case LIGHT_OWRITE:
		fd = fopen(file_name, "wb");
		break;
	case LIGHT_OAPPEND:
		fd = fopen(file_name, "ab");
		break;
	}

	return fd;
}